

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMutex.h
# Opt level: O0

void __thiscall liblogger::LogMutex::Unlock(LogMutex *this)

{
  undefined8 uVar1;
  int iVar2;
  pthread_mutex_t *in_RDI;
  string *in_stack_ffffffffffffffc8;
  LogException *in_stack_ffffffffffffffd0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  iVar2 = pthread_mutex_unlock(in_RDI);
  if (iVar2 < 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    LogException::LogException(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar1,&LogException::typeinfo,LogException::~LogException);
  }
  return;
}

Assistant:

void Unlock() {
				if (pthread_mutex_unlock(&m_mutex) < 0)
					throw(LogException("pthread_mutex_unlock failed"));
			}